

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O2

void HBLAS3::hblas3_gemm_square_HH_TC_ZH_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_wrap_stringstream<char> *this;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  basic_wrap_stringstream<char> local_208;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_208.m_str._M_string_length = 0;
  local_208.m_str.field_2._M_allocated_capacity = 0;
  local_208.m_str.field_2._8_8_ = 0;
  local_210 = "";
  local_208._320_8_ = 0;
  local_208._328_8_ = 0;
  local_208._336_8_ = 0;
  local_208._344_8_ = 0;
  local_208._352_8_ = 0;
  local_208._360_8_ = 0;
  local_208._368_8_ = 0;
  local_208.m_str._M_dataplus._M_p = (pointer)0x0;
  local_208._256_8_ = 0;
  local_208._264_8_ = 0;
  local_208._272_8_ = 0;
  local_208._280_8_ = 0;
  local_208._288_8_ = 0;
  local_208._296_8_ = 0;
  local_208._304_8_ = 0;
  local_208._312_8_ = 0;
  local_208._192_8_ = 0;
  local_208._200_8_ = 0;
  local_208._208_8_ = 0;
  local_208._216_8_ = 0;
  local_208._224_8_ = 0;
  local_208._232_8_ = 0;
  local_208._240_8_ = 0;
  local_208._248_8_ = 0;
  local_208._128_8_ = 0;
  local_208._136_8_ = 0;
  local_208._144_8_ = 0;
  local_208._152_8_ = 0;
  local_208._160_8_ = 0;
  local_208._168_8_ = 0;
  local_208._176_8_ = 0;
  local_208._184_8_ = 0;
  local_208._64_8_ = 0;
  local_208._72_8_ = 0;
  local_208._80_8_ = 0;
  local_208._88_8_ = 0;
  local_208._96_8_ = 0;
  local_208._104_8_ = 0;
  local_208._112_8_ = 0;
  local_208._120_8_ = 0;
  local_208.m_stream = (wrapped_stream)0x0;
  local_208._1_7_ = 0;
  local_208._8_8_ = 0;
  local_208._16_8_ = 0;
  local_208._24_8_ = 0;
  local_208._32_8_ = 0;
  local_208._40_8_ = 0;
  local_208._48_8_ = 0;
  local_208._56_8_ = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"hblas3_gemm_square_HH_TC_ZH");
  std::operator<<((ostream *)&local_208,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_30 = (pbVar2->_M_dataplus)._M_p;
  local_28 = local_30 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_218,0x176);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_220 = "";
  local_208.m_str._M_string_length = 0;
  local_208.m_str.field_2._M_allocated_capacity = 0;
  local_208.m_str.field_2._8_8_ = 0;
  local_208._320_8_ = 0;
  local_208._328_8_ = 0;
  local_208._336_8_ = 0;
  local_208._344_8_ = 0;
  local_208._352_8_ = 0;
  local_208._360_8_ = 0;
  local_208._368_8_ = 0;
  local_208.m_str._M_dataplus._M_p = (pointer)0x0;
  local_208._256_8_ = 0;
  local_208._264_8_ = 0;
  local_208._272_8_ = 0;
  local_208._280_8_ = 0;
  local_208._288_8_ = 0;
  local_208._296_8_ = 0;
  local_208._304_8_ = 0;
  local_208._312_8_ = 0;
  local_208._192_8_ = 0;
  local_208._200_8_ = 0;
  local_208._208_8_ = 0;
  local_208._216_8_ = 0;
  local_208._224_8_ = 0;
  local_208._232_8_ = 0;
  local_208._240_8_ = 0;
  local_208._248_8_ = 0;
  local_208._128_8_ = 0;
  local_208._136_8_ = 0;
  local_208._144_8_ = 0;
  local_208._152_8_ = 0;
  local_208._160_8_ = 0;
  local_208._168_8_ = 0;
  local_208._176_8_ = 0;
  local_208._184_8_ = 0;
  local_208._64_8_ = 0;
  local_208._72_8_ = 0;
  local_208._80_8_ = 0;
  local_208._88_8_ = 0;
  local_208._96_8_ = 0;
  local_208._104_8_ = 0;
  local_208._112_8_ = 0;
  local_208._120_8_ = 0;
  local_208.m_stream = (wrapped_stream)0x0;
  local_208._1_7_ = 0;
  local_208._8_8_ = 0;
  local_208._16_8_ = 0;
  local_208._24_8_ = 0;
  local_208._32_8_ = 0;
  local_208._40_8_ = 0;
  local_208._48_8_ = 0;
  local_208._56_8_ = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"hblas3_gemm_square_HH_TC_ZH");
  std::operator<<((ostream *)&local_208,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_40 = (pbVar2->_M_dataplus)._M_p;
  local_38 = local_40 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x176);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_230 = "";
  local_208.m_str._M_string_length = 0;
  local_208.m_str.field_2._M_allocated_capacity = 0;
  local_208.m_str.field_2._8_8_ = 0;
  local_208._320_8_ = 0;
  local_208._328_8_ = 0;
  local_208._336_8_ = 0;
  local_208._344_8_ = 0;
  local_208._352_8_ = 0;
  local_208._360_8_ = 0;
  local_208._368_8_ = 0;
  local_208.m_str._M_dataplus._M_p = (pointer)0x0;
  local_208._256_8_ = 0;
  local_208._264_8_ = 0;
  local_208._272_8_ = 0;
  local_208._280_8_ = 0;
  local_208._288_8_ = 0;
  local_208._296_8_ = 0;
  local_208._304_8_ = 0;
  local_208._312_8_ = 0;
  local_208._192_8_ = 0;
  local_208._200_8_ = 0;
  local_208._208_8_ = 0;
  local_208._216_8_ = 0;
  local_208._224_8_ = 0;
  local_208._232_8_ = 0;
  local_208._240_8_ = 0;
  local_208._248_8_ = 0;
  local_208._128_8_ = 0;
  local_208._136_8_ = 0;
  local_208._144_8_ = 0;
  local_208._152_8_ = 0;
  local_208._160_8_ = 0;
  local_208._168_8_ = 0;
  local_208._176_8_ = 0;
  local_208._184_8_ = 0;
  local_208._64_8_ = 0;
  local_208._72_8_ = 0;
  local_208._80_8_ = 0;
  local_208._88_8_ = 0;
  local_208._96_8_ = 0;
  local_208._104_8_ = 0;
  local_208._112_8_ = 0;
  local_208._120_8_ = 0;
  local_208.m_stream = (wrapped_stream)0x0;
  local_208._1_7_ = 0;
  local_208._8_8_ = 0;
  local_208._16_8_ = 0;
  local_208._24_8_ = 0;
  local_208._32_8_ = 0;
  local_208._40_8_ = 0;
  local_208._48_8_ = 0;
  local_208._56_8_ = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"hblas3_gemm_square_HH_TC_ZH");
  std::operator<<((ostream *)&local_208,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_50 = (pbVar2->_M_dataplus)._M_p;
  local_48 = local_50 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x176);
  this = &local_208;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,HAXX::quaternion<double>,(char)84,(char)67,100ul,100ul,100ul>
            ((HBLAS3 *)this);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_240 = "";
  local_208.m_str._M_string_length = 0;
  local_208.m_str.field_2._M_allocated_capacity = 0;
  local_208.m_str.field_2._8_8_ = 0;
  local_208._320_8_ = 0;
  local_208._328_8_ = 0;
  local_208._336_8_ = 0;
  local_208._344_8_ = 0;
  local_208._352_8_ = 0;
  local_208._360_8_ = 0;
  local_208._368_8_ = 0;
  local_208.m_str._M_dataplus._M_p = (pointer)0x0;
  local_208._256_8_ = 0;
  local_208._264_8_ = 0;
  local_208._272_8_ = 0;
  local_208._280_8_ = 0;
  local_208._288_8_ = 0;
  local_208._296_8_ = 0;
  local_208._304_8_ = 0;
  local_208._312_8_ = 0;
  local_208._192_8_ = 0;
  local_208._200_8_ = 0;
  local_208._208_8_ = 0;
  local_208._216_8_ = 0;
  local_208._224_8_ = 0;
  local_208._232_8_ = 0;
  local_208._240_8_ = 0;
  local_208._248_8_ = 0;
  local_208._128_8_ = 0;
  local_208._136_8_ = 0;
  local_208._144_8_ = 0;
  local_208._152_8_ = 0;
  local_208._160_8_ = 0;
  local_208._168_8_ = 0;
  local_208._176_8_ = 0;
  local_208._184_8_ = 0;
  local_208._64_8_ = 0;
  local_208._72_8_ = 0;
  local_208._80_8_ = 0;
  local_208._88_8_ = 0;
  local_208._96_8_ = 0;
  local_208._104_8_ = 0;
  local_208._112_8_ = 0;
  local_208._120_8_ = 0;
  local_208.m_stream = (wrapped_stream)0x0;
  local_208._1_7_ = 0;
  local_208._8_8_ = 0;
  local_208._16_8_ = 0;
  local_208._24_8_ = 0;
  local_208._32_8_ = 0;
  local_208._40_8_ = 0;
  local_208._48_8_ = 0;
  local_208._56_8_ = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"hblas3_gemm_square_HH_TC_ZH");
  std::operator<<((ostream *)&local_208,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_60 = (pbVar2->_M_dataplus)._M_p;
  local_58 = local_60 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x176);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx";
  local_250 = "";
  local_208.m_str._M_string_length = 0;
  local_208.m_str.field_2._M_allocated_capacity = 0;
  local_208.m_str.field_2._8_8_ = 0;
  local_208._320_8_ = 0;
  local_208._328_8_ = 0;
  local_208._336_8_ = 0;
  local_208._344_8_ = 0;
  local_208._352_8_ = 0;
  local_208._360_8_ = 0;
  local_208._368_8_ = 0;
  local_208.m_str._M_dataplus._M_p = (pointer)0x0;
  local_208._256_8_ = 0;
  local_208._264_8_ = 0;
  local_208._272_8_ = 0;
  local_208._280_8_ = 0;
  local_208._288_8_ = 0;
  local_208._296_8_ = 0;
  local_208._304_8_ = 0;
  local_208._312_8_ = 0;
  local_208._192_8_ = 0;
  local_208._200_8_ = 0;
  local_208._208_8_ = 0;
  local_208._216_8_ = 0;
  local_208._224_8_ = 0;
  local_208._232_8_ = 0;
  local_208._240_8_ = 0;
  local_208._248_8_ = 0;
  local_208._128_8_ = 0;
  local_208._136_8_ = 0;
  local_208._144_8_ = 0;
  local_208._152_8_ = 0;
  local_208._160_8_ = 0;
  local_208._168_8_ = 0;
  local_208._176_8_ = 0;
  local_208._184_8_ = 0;
  local_208._64_8_ = 0;
  local_208._72_8_ = 0;
  local_208._80_8_ = 0;
  local_208._88_8_ = 0;
  local_208._96_8_ = 0;
  local_208._104_8_ = 0;
  local_208._112_8_ = 0;
  local_208._120_8_ = 0;
  local_208.m_stream = (wrapped_stream)0x0;
  local_208._1_7_ = 0;
  local_208._8_8_ = 0;
  local_208._16_8_ = 0;
  local_208._24_8_ = 0;
  local_208._32_8_ = 0;
  local_208._40_8_ = 0;
  local_208._48_8_ = 0;
  local_208._56_8_ = 0;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_208);
  std::operator<<((ostream *)&local_208,'\"');
  std::operator<<((ostream *)&local_208,"hblas3_gemm_square_HH_TC_ZH");
  std::operator<<((ostream *)&local_208,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_208);
  local_70 = (pbVar2->_M_dataplus)._M_p;
  local_68 = local_70 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x176);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_208);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas3_gemm_square_HH_TC_ZH) {
  hblas3_gemm<qd,qd,cd,qd,'T','C'>();
}